

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O1

parser_node * amrex::parser_newf3(parser_f3_t ftype,parser_node *n1,parser_node *n2,parser_node *n3)

{
  parser_node *ppVar1;
  
  ppVar1 = (parser_node *)malloc(0x28);
  ppVar1->type = PARSER_F3;
  ppVar1->l = n1;
  ppVar1->r = n2;
  (ppVar1->lvp).n = n3;
  ppVar1->rip = ftype;
  return ppVar1;
}

Assistant:

struct parser_node*
parser_newf3 (enum parser_f3_t ftype, struct parser_node* n1, struct parser_node* n2,
              struct parser_node* n3)
{
    auto tmp = (struct parser_f3*) std::malloc(sizeof(struct parser_f3));
    tmp->type = PARSER_F3;
    tmp->n1 = n1;
    tmp->n2 = n2;
    tmp->n3 = n3;
    tmp->ftype = ftype;
    return (struct parser_node*) tmp;
}